

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O0

void __thiscall QAbstractScrollArea::keyPressEvent(QAbstractScrollArea *this,QKeyEvent *e)

{
  bool bVar1;
  int iVar2;
  LayoutDirection LVar3;
  QAbstractScrollAreaPrivate *pQVar4;
  uint *in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *extraout_RDX_01;
  sockaddr *extraout_RDX_02;
  sockaddr *extraout_RDX_03;
  sockaddr *extraout_RDX_04;
  sockaddr *__addr;
  QKeyEvent *in_RSI;
  QAbstractScrollAreaPrivate *d;
  undefined8 in_stack_ffffffffffffffc8;
  StandardKey key;
  QKeyEvent *in_stack_ffffffffffffffd0;
  SliderAction action;
  
  key = (StandardKey)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  pQVar4 = d_func((QAbstractScrollArea *)0x499101);
  action = (SliderAction)((ulong)pQVar4 >> 0x20);
  bVar1 = ::operator==(in_stack_ffffffffffffffd0,key);
  if (bVar1) {
    iVar2 = 4;
    QAbstractSlider::triggerAction((QAbstractSlider *)in_RSI,action);
    __addr = extraout_RDX;
  }
  else {
    bVar1 = ::operator==(in_stack_ffffffffffffffd0,key);
    if (bVar1) {
      iVar2 = 3;
      QAbstractSlider::triggerAction((QAbstractSlider *)in_RSI,action);
      __addr = extraout_RDX_00;
    }
    else {
      iVar2 = QKeyEvent::key(in_RSI);
      in_RCX = &switchD_00499198::switchdataD_00ab22d8;
      switch(iVar2) {
      case 0x1000012:
        LVar3 = QWidget::layoutDirection((QWidget *)0x4991e9);
        in_RCX = (uint *)(ulong)LVar3;
        iVar2 = 1;
        if (LVar3 == LeftToRight) {
          iVar2 = 2;
        }
        QAbstractSlider::triggerAction((QAbstractSlider *)in_RSI,action);
        __addr = extraout_RDX_03;
        break;
      case 0x1000013:
        iVar2 = 2;
        QAbstractSlider::triggerAction((QAbstractSlider *)in_RSI,action);
        __addr = extraout_RDX_01;
        break;
      case 0x1000014:
        LVar3 = QWidget::layoutDirection((QWidget *)0x499221);
        in_RCX = (uint *)(ulong)LVar3;
        iVar2 = 2;
        if (LVar3 == LeftToRight) {
          iVar2 = 1;
        }
        QAbstractSlider::triggerAction((QAbstractSlider *)in_RSI,action);
        __addr = extraout_RDX_04;
        break;
      case 0x1000015:
        iVar2 = 1;
        QAbstractSlider::triggerAction((QAbstractSlider *)in_RSI,action);
        __addr = extraout_RDX_02;
        break;
      default:
        QEvent::ignore((QEvent *)in_RSI);
        return;
      }
    }
  }
  QEvent::accept((QEvent *)in_RSI,iVar2,__addr,in_RCX);
  return;
}

Assistant:

void QAbstractScrollArea::keyPressEvent(QKeyEvent * e)
{
    Q_D(QAbstractScrollArea);
    if (false){
#ifndef QT_NO_SHORTCUT
    } else if (e == QKeySequence::MoveToPreviousPage) {
        d->vbar->triggerAction(QScrollBar::SliderPageStepSub);
    } else if (e == QKeySequence::MoveToNextPage) {
        d->vbar->triggerAction(QScrollBar::SliderPageStepAdd);
#endif
    } else {
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled() && !hasEditFocus()) {
            e->ignore();
            return;
        }
#endif
        switch (e->key()) {
        case Qt::Key_Up:
            d->vbar->triggerAction(QScrollBar::SliderSingleStepSub);
            break;
        case Qt::Key_Down:
            d->vbar->triggerAction(QScrollBar::SliderSingleStepAdd);
            break;
        case Qt::Key_Left:
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled() && hasEditFocus()
            && (!d->hbar->isVisible() || d->hbar->value() == d->hbar->minimum())) {
            //if we aren't using the hbar or we are already at the leftmost point ignore
            e->ignore();
            return;
        }
#endif
            d->hbar->triggerAction(
                layoutDirection() == Qt::LeftToRight
                ? QScrollBar::SliderSingleStepSub : QScrollBar::SliderSingleStepAdd);
            break;
        case Qt::Key_Right:
#ifdef QT_KEYPAD_NAVIGATION
        if (QApplicationPrivate::keypadNavigationEnabled() && hasEditFocus()
            && (!d->hbar->isVisible() || d->hbar->value() == d->hbar->maximum())) {
            //if we aren't using the hbar or we are already at the rightmost point ignore
            e->ignore();
            return;
        }
#endif
            d->hbar->triggerAction(
                layoutDirection() == Qt::LeftToRight
                ? QScrollBar::SliderSingleStepAdd : QScrollBar::SliderSingleStepSub);
            break;
        default:
            e->ignore();
            return;
        }
    }
    e->accept();
}